

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmArea.c
# Opt level: O0

int Abc_NtkPrecomputePrint(Mio_Cell2_t *pCells,int nCells,Vec_Int_t *vInfo)

{
  uint nVarsInit;
  int iVar1;
  int iVar2;
  int i_00;
  float fVar3;
  int Diff;
  int iPerm;
  int iCellA;
  int nFanins;
  int nRecUsed;
  int Index;
  int v;
  int n;
  int i;
  Vec_Int_t *vInfo_local;
  int nCells_local;
  Mio_Cell2_t *pCells_local;
  
  nFanins = 0;
  iCellA = 0;
  for (v = 2; v < nCells; v = v + 1) {
    nVarsInit = *(uint *)&pCells[v].field_0x10 >> 0x1c;
    printf("%3d : %8s   Fanins = %d   ",(ulong)(uint)v,pCells[v].pName,(ulong)nVarsInit);
    Dau_DsdPrintFromTruth(&pCells[v].uTruth,nVarsInit);
    for (Index = 0; Index <= (int)nVarsInit; Index = Index + 1) {
      iVar1 = Vec_IntEntry(vInfo,nFanins);
      iVar2 = Vec_IntEntry(vInfo,nFanins + 1);
      i_00 = Vec_IntEntry(vInfo,nFanins + 2);
      if (iVar1 != -1) {
        printf("%d : {",(ulong)(uint)Index);
        for (nRecUsed = 0; nRecUsed < (int)nVarsInit; nRecUsed = nRecUsed + 1) {
          printf(" %d ",(ulong)(iVar2 >> ((byte)(nRecUsed << 2) & 0x1f) & 0xf));
        }
        printf("}  Index = %d  ",(ulong)(uint)nFanins);
        fVar3 = Scl_Int2Flt(i_00);
        printf("Gain = %6.2f  ",(double)fVar3);
        Dau_DsdPrintFromTruth(&pCells[iVar1].uTruth,*(uint *)&pCells[iVar1].field_0x10 >> 0x1c);
        iCellA = iCellA + 1;
      }
      nFanins = nFanins + 3;
    }
  }
  return iCellA;
}

Assistant:

int Abc_NtkPrecomputePrint( Mio_Cell2_t * pCells, int nCells, Vec_Int_t * vInfo )
{
    int i, n, v, Index = 0, nRecUsed = 0;
    for ( i = 2; i < nCells; i++ )
    {
        int nFanins = pCells[i].nFanins;
        printf( "%3d : %8s   Fanins = %d   ", i, pCells[i].pName, nFanins );
        Dau_DsdPrintFromTruth( &pCells[i].uTruth, nFanins );
        for ( n = 0; n <= nFanins; n++, Index += 3 )
        {
            int iCellA = Vec_IntEntry( vInfo, Index+0 );
            int iPerm  = Vec_IntEntry( vInfo, Index+1 );
            int Diff   = Vec_IntEntry( vInfo, Index+2 );
            if ( iCellA == -1 )
                continue;
            printf( "%d : {", n );
            for ( v = 0; v < nFanins; v++ )
                printf( " %d ", (iPerm >> (v << 2)) & 15 );
            printf( "}  Index = %d  ", Index );

            printf( "Gain = %6.2f  ", Scl_Int2Flt(Diff) );
            Dau_DsdPrintFromTruth( &pCells[iCellA].uTruth, pCells[iCellA].nFanins );
            nRecUsed++;
        }
    }
    return nRecUsed;
}